

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

int Dar2_LibBuildBest(Gia_Man_t *p,Vec_Int_t *vLeavesBest2,int OutBest)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  Dar_LibObj_t *pDVar3;
  int local_28;
  int local_24;
  int Counter;
  int iLeaf;
  int i;
  int OutBest_local;
  Vec_Int_t *vLeavesBest2_local;
  Gia_Man_t *p_local;
  
  local_28 = 4;
  iLeaf = OutBest;
  _i = vLeavesBest2;
  vLeavesBest2_local = (Vec_Int_t *)p;
  iVar1 = Vec_IntSize(vLeavesBest2);
  if (iVar1 != 4) {
    __assert_fail("Vec_IntSize(vLeavesBest2) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x51f,"int Dar2_LibBuildBest(Gia_Man_t *, Vec_Int_t *, int)");
  }
  for (Counter = 0; iVar1 = Counter, iVar2 = Vec_IntSize(_i), iVar1 < iVar2; Counter = Counter + 1)
  {
    local_24 = Vec_IntEntry(_i,Counter);
    s_DarLib->pDatas[Counter].field_0.iGunc = local_24;
  }
  pDVar3 = Dar_LibObj(s_DarLib,iLeaf);
  Dar2_LibBuildClear_rec(pDVar3,&local_28);
  p_00 = vLeavesBest2_local;
  pDVar3 = Dar_LibObj(s_DarLib,iLeaf);
  iVar1 = Dar2_LibBuildBest_rec((Gia_Man_t *)p_00,pDVar3);
  return iVar1;
}

Assistant:

int Dar2_LibBuildBest( Gia_Man_t * p, Vec_Int_t * vLeavesBest2, int OutBest )
{
    int i, iLeaf, Counter = 4;
    assert( Vec_IntSize(vLeavesBest2) == 4 );
    Vec_IntForEachEntry( vLeavesBest2, iLeaf, i )
        s_DarLib->pDatas[i].iGunc = iLeaf;
    Dar2_LibBuildClear_rec( Dar_LibObj(s_DarLib, OutBest), &Counter );
    return Dar2_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, OutBest) );
}